

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O0

void generateNative<true>(uint32_t nonce)

{
  ostream *this;
  uint32_t in_EDI;
  Program prog;
  uint8_t scratchpad [2097152];
  uint8_t blockTemplate [76];
  uint64_t hash [8];
  Program *in_stack_ffffffffffdff6e8;
  ostream *in_stack_ffffffffffdff6f0;
  void *in_stack_ffffffffffdff778;
  size_t in_stack_ffffffffffdff780;
  void *in_stack_ffffffffffdff788;
  size_t in_stack_ffffffffffdff7d8;
  void *in_stack_ffffffffffdff7e0;
  size_t in_stack_ffffffffffdff7e8;
  void *in_stack_ffffffffffdff7f0;
  size_t in_stack_ffffffffffdff7f8;
  void *in_stack_ffffffffffdff800;
  undefined1 local_98 [39];
  undefined1 auStack_71 [109];
  uint32_t local_4;
  
  local_4 = in_EDI;
  memcpy(local_98,blockTemplate_,0x4c);
  store32(auStack_71,local_4);
  randomx_blake2b(in_stack_ffffffffffdff800,in_stack_ffffffffffdff7f8,in_stack_ffffffffffdff7f0,
                  in_stack_ffffffffffdff7e8,in_stack_ffffffffffdff7e0,in_stack_ffffffffffdff7d8);
  fillAes1Rx4<true>(in_stack_ffffffffffdff788,in_stack_ffffffffffdff780,in_stack_ffffffffffdff778);
  fillAes1Rx4<true>(in_stack_ffffffffffdff788,in_stack_ffffffffffdff780,in_stack_ffffffffffdff778);
  this = randomx::operator<<(in_stack_ffffffffffdff6f0,in_stack_ffffffffffdff6e8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void generateNative(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[randomx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, randomx::ScratchpadSize, scratchpad);
	alignas(16) randomx::Program prog;
	fillAes1Rx4<softAes>((void*)hash, sizeof(prog), &prog);
	std::cout << prog << std::endl;
}